

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcSymObj * __thiscall CTcParser::add_gen_obj(CTcParser *this,char *clsname)

{
  CTcPrsSymtab *this_00;
  size_t len;
  CTcSymObj *pCVar1;
  
  this_00 = this->global_symtab_;
  len = strlen(clsname);
  pCVar1 = (CTcSymObj *)CTcPrsSymtab::find(this_00,clsname,len);
  if ((pCVar1 != (CTcSymObj *)0x0) &&
     (*(int *)&(pCVar1->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.
               super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 2)) {
    pCVar1 = add_gen_obj(this,pCVar1);
    return pCVar1;
  }
  return (CTcSymObj *)0x0;
}

Assistant:

CTcSymObj *CTcParser::add_gen_obj(const char *clsname)
{
    /* look up the class symbol */
    CTcSymObj *cls = (CTcSymObj *)global_symtab_->find(
        clsname, strlen(clsname));

    /* make sure we found an object symbol */
    if (cls != 0 && cls->get_type() == TC_SYM_OBJ)
    {
        /* got it - go create the object */
        return add_gen_obj(cls);
    }
    else
    {
        /* not an object - return failure */
        return 0;
    }
}